

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O3

bool google::protobuf::
     InsertIfNotPresent<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
               (unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                *collection,first_type *key,second_type *value)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  size_type __bkt;
  __buckets_ptr pp_Var5;
  ulong uVar6;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var7;
  char cVar8;
  key_type *__key;
  size_type __n;
  ulong uVar9;
  _Hash_node_base _Var10;
  _Hash_node_base *p_Var11;
  undefined1 auVar12 [16];
  __buckets_alloc_type __alloc;
  pointer __ptr_1;
  new_allocator<std::__detail::_Hash_node_base_*> local_41;
  __node_ptr local_40;
  _Hash_node_base *local_38;
  
  p_Var3 = (_Hash_node_base *)key->first;
  p_Var4 = (_Hash_node_base *)key->second;
  cVar8 = *(char *)&p_Var4->_M_nxt;
  if (cVar8 == '\0') {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    p_Var11 = p_Var4;
    do {
      p_Var11 = (_Hash_node_base *)((long)&p_Var11->_M_nxt + 1);
      uVar6 = (long)cVar8 + uVar6 * 5;
      cVar8 = *(char *)&p_Var11->_M_nxt;
    } while (cVar8 != '\0');
  }
  p_Var11 = (_Hash_node_base *)((long)p_Var3 * 0x1000193 ^ uVar6);
  __bkt = (collection->_M_h)._M_bucket_count;
  __key = (key_type *)((ulong)p_Var11 % __bkt);
  local_40 = std::
             _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_node((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)(collection->_M_h)._M_buckets,__bkt,__key,(__hash_code)p_Var3);
  if (local_40 == (__node_ptr)0x0) {
    local_38 = (_Hash_node_base *)operator_new(0x28);
    local_38->_M_nxt = (_Hash_node_base *)0x0;
    local_38[1]._M_nxt = p_Var3;
    local_38[2]._M_nxt = p_Var4;
    local_38[3]._M_nxt = (_Hash_node_base *)value;
    auVar12 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(collection->_M_h)._M_rehash_policy,
                         (collection->_M_h)._M_bucket_count,(collection->_M_h)._M_element_count);
    __n = auVar12._8_8_;
    if ((auVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s = (collection->_M_h)._M_buckets;
    }
    else {
      if (__n == 1) {
        __s = &(collection->_M_h)._M_single_bucket;
        (collection->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (&local_41,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var10._M_nxt = (collection->_M_h)._M_before_begin._M_nxt;
      (collection->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var10._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(collection->_M_h)._M_before_begin;
        uVar6 = 0;
        do {
          p_Var3 = (_Var10._M_nxt)->_M_nxt;
          uVar9 = (ulong)_Var10._M_nxt[4]._M_nxt % __n;
          if (__s[uVar9] == (_Hash_node_base *)0x0) {
            (_Var10._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var10._M_nxt;
            __s[uVar9] = p_Var1;
            if ((_Var10._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var7 = __s + uVar6;
              goto LAB_003190b9;
            }
          }
          else {
            (_Var10._M_nxt)->_M_nxt = __s[uVar9]->_M_nxt;
            pp_Var7 = &__s[uVar9]->_M_nxt;
            uVar9 = uVar6;
LAB_003190b9:
            *pp_Var7 = _Var10._M_nxt;
          }
          _Var10._M_nxt = p_Var3;
          uVar6 = uVar9;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var5 = (collection->_M_h)._M_buckets;
      if (&(collection->_M_h)._M_single_bucket != pp_Var5) {
        operator_delete(pp_Var5);
      }
      (collection->_M_h)._M_bucket_count = __n;
      (collection->_M_h)._M_buckets = __s;
      __key = (key_type *)((ulong)p_Var11 % __n);
    }
    local_38[4]._M_nxt = p_Var11;
    if (__s[(long)__key] == (_Hash_node_base *)0x0) {
      p_Var3 = (collection->_M_h)._M_before_begin._M_nxt;
      local_38->_M_nxt = p_Var3;
      (collection->_M_h)._M_before_begin._M_nxt = local_38;
      if (p_Var3 != (_Hash_node_base *)0x0) {
        __s[(ulong)p_Var3[4]._M_nxt % (collection->_M_h)._M_bucket_count] = local_38;
        __s = (collection->_M_h)._M_buckets;
      }
      __s[(long)__key] = &(collection->_M_h)._M_before_begin;
    }
    else {
      local_38->_M_nxt = __s[(long)__key]->_M_nxt;
      __s[(long)__key]->_M_nxt = local_38;
    }
    psVar2 = &(collection->_M_h)._M_element_count;
    *psVar2 = *psVar2 + 1;
  }
  return local_40 == (__node_ptr)0x0;
}

Assistant:

bool InsertIfNotPresent(
    Collection* const collection,
    const typename Collection::value_type::first_type& key,
    const typename Collection::value_type::second_type& value) {
  return InsertIfNotPresent(
      collection, typename Collection::value_type(key, value));
}